

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<int,(unsigned_char)4>>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  Value VVar3;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  auVar1 = packssdw((undefined1  [16])VVar3,(undefined1  [16])VVar3);
  VVar3._0_8_ = auVar1._0_8_;
  auVar1 = packssdw((undefined1  [16])VVar2,(undefined1  [16])VVar2);
  VVar3._8_8_ = auVar1._0_8_;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[i] = Saturate<SL, TL>(lhs.v[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[T::lanes + i] = Saturate<SL, TL>(rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}